

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O2

void __thiscall IR::RegOpnd::RegOpnd(RegOpnd *this,RegOpnd *other,StackSym *sym)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  
  Opnd::Opnd(&this->super_Opnd);
  (this->super_Opnd)._vptr_Opnd = (_func_int **)&PTR_DummyFunction_01374fd8;
  Initialize(this,sym,other->m_reg,(other->super_Opnd).m_type);
  (this->super_Opnd).m_valueType.field_0 = (other->super_Opnd).m_valueType.field_0;
  Opnd::SetIsJITOptimizedReg(&this->super_Opnd,(bool)(((other->super_Opnd).field_0xb & 8) >> 3));
  bVar2 = other->field_0x18 & 4;
  bVar1 = this->field_0x18;
  this->field_0x18 = bVar1 & 0xfb | bVar2;
  bVar3 = other->field_0x18 & 0x10;
  this->field_0x18 = bVar1 & 0xeb | bVar2 | bVar3;
  this->field_0x18 = bVar1 & 0xab | bVar2 | bVar3 | other->field_0x18 & 0x40;
  return;
}

Assistant:

RegOpnd::RegOpnd(const RegOpnd &other, StackSym *const sym)
{
    Initialize(sym, other.m_reg, other.m_type);

    m_valueType = other.m_valueType;
    SetIsJITOptimizedReg(other.GetIsJITOptimizedReg());
    m_dontDeadStore = other.m_dontDeadStore;
    m_wasNegativeZeroPreventedByBailout = other.m_wasNegativeZeroPreventedByBailout;

#if DBG
    m_symValueFrozen = other.m_symValueFrozen;
#endif
}